

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::StructPackingPass::assignStructMemberOffsets
          (StructPackingPass *this,uint32_t structIdToPack,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *structMemberTypes)

{
  uint uVar1;
  Module *pMVar2;
  uint **ppuVar3;
  Type *type;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  Operand *pOVar8;
  uint **ppuVar9;
  uint uVar10;
  Instruction **ppIVar11;
  Instruction *instr;
  uint uVar12;
  Instruction *pIVar13;
  anon_class_4_1_b8b55562 isMemberOffsetDecoration;
  
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar11 = (Instruction **)
             ((long)&(pMVar2->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar13 = (Instruction *)
            ((long)&(pMVar2->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  isMemberOffsetDecoration.structIdToPack = structIdToPack;
  while( true ) {
    instr = *ppIVar11;
    if (instr == pIVar13) {
      return SuccessWithoutChange;
    }
    bVar4 = assignStructMemberOffsets::anon_class_4_1_b8b55562::operator()
                      (&isMemberOffsetDecoration,instr);
    if (bVar4) break;
    ppIVar11 = &(instr->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  uVar10 = 0;
  uVar7 = 0;
  uVar12 = 1;
  while( true ) {
    pOVar8 = Instruction::GetOperand(instr,1);
    ppuVar3 = (uint **)(pOVar8->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar9 = &(pOVar8->words).small_data_;
    if (ppuVar3 != (uint **)0x0) {
      ppuVar9 = ppuVar3;
    }
    uVar1 = **ppuVar9;
    if (uVar1 < (uint)uVar7) {
      return Failure;
    }
    type = (structMemberTypes->
           super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar1];
    uVar5 = getPackedAlignment(this,type);
    uVar6 = getPackedSize(this,type);
    if (((this->packingRules_ - HlslCbuffer < 2) && (0xf < ((uVar10 - 1) + uVar6 ^ uVar10))) &&
       (uVar5 < 0x11)) {
      uVar5 = 0x10;
    }
    if (uVar12 < uVar5) {
      uVar12 = uVar5;
    }
    uVar10 = -uVar12 & (uVar10 - 1) + uVar12;
    if (type->kind_ != kStruct) {
      uVar5 = 1;
    }
    pOVar8 = Instruction::GetOperand(instr,3);
    ppuVar3 = (uint **)(pOVar8->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar9 = &(pOVar8->words).small_data_;
    if (ppuVar3 != (uint **)0x0) {
      ppuVar9 = ppuVar3;
    }
    if (**ppuVar9 < uVar10) break;
    pOVar8 = Instruction::GetOperand(instr,3);
    ppuVar3 = (uint **)(pOVar8->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar9 = &(pOVar8->words).small_data_;
    if (ppuVar3 != (uint **)0x0) {
      ppuVar9 = ppuVar3;
    }
    **ppuVar9 = uVar10;
    instr = (instr->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (instr == pIVar13) {
      return SuccessWithChange;
    }
    uVar10 = uVar10 + uVar6;
    bVar4 = assignStructMemberOffsets::anon_class_4_1_b8b55562::operator()
                      (&isMemberOffsetDecoration,instr);
    uVar7 = (ulong)uVar1;
    uVar12 = uVar5;
    if (!bVar4) {
      return SuccessWithChange;
    }
  }
  return Failure;
}

Assistant:

Pass::Status StructPackingPass::assignStructMemberOffsets(
    uint32_t structIdToPack,
    const std::vector<const analysis::Type*>& structMemberTypes) {
  // Returns true if the specified instruction is a OpMemberDecorate for the
  // struct we're looking for with an offset decoration
  auto isMemberOffsetDecoration =
      [structIdToPack](const Instruction& instr) -> bool {
    return instr.opcode() == spv::Op::OpMemberDecorate &&
           instr.GetOperand(0).AsId() == structIdToPack &&
           static_cast<spv::Decoration>(instr.GetOperand(2).words[0]) ==
               spv::Decoration::Offset;
  };

  bool modified = false;

  // Find and re-assign all member offset decorations
  for (auto it = context()->module()->annotation_begin(),
            itEnd = context()->module()->annotation_end();
       it != itEnd; ++it) {
    if (isMemberOffsetDecoration(*it)) {
      // Found first member decoration with offset, we expect all other
      // offsets right after the first one
      uint32_t prevMemberIndex = 0;
      uint32_t currentOffset = 0;
      uint32_t padAlignment = 1;
      do {
        const uint32_t memberIndex = it->GetOperand(1).words[0];
        if (memberIndex < prevMemberIndex) {
          // Failure: we expect all members to appear in consecutive order
          return Status::Failure;
        }

        // Apply alignment rules to current offset
        const analysis::Type& memberType = *structMemberTypes[memberIndex];
        uint32_t packedAlignment = getPackedAlignment(memberType);
        uint32_t packedSize = getPackedSize(memberType);

        if (isPackingHlsl(packingRules_)) {
          // If a member crosses vec4 boundaries, alignment is size of vec4
          if (currentOffset / 16 != (currentOffset + packedSize - 1) / 16)
            packedAlignment = std::max<uint32_t>(packedAlignment, 16u);
        }

        const uint32_t alignment =
            std::max<uint32_t>(packedAlignment, padAlignment);
        currentOffset = alignPow2(currentOffset, alignment);
        padAlignment = getPadAlignment(memberType, packedAlignment);

        // Override packed offset in instruction
        if (it->GetOperand(3).words[0] < currentOffset) {
          // Failure: packing resulted in higher offset for member than
          // previously generated
          return Status::Failure;
        }

        it->GetOperand(3).words[0] = currentOffset;
        modified = true;

        // Move to next member
        ++it;
        prevMemberIndex = memberIndex;
        currentOffset += packedSize;
      } while (it != itEnd && isMemberOffsetDecoration(*it));

      // We're done with all decorations for the struct of interest
      break;
    }
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}